

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

char * __thiscall
CVmDateLocale::index_list(CVmDateLocale *this,size_t *itemlen,int item,int idx,int sticky)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  bool bVar4;
  size_t len;
  char *local_20;
  
  pcVar1 = get(this,(size_t *)&local_20,item);
  if (pcVar1 == (char *)0x0) {
    *itemlen = 0;
LAB_0029097b:
    pcVar1 = (char *)0x0;
  }
  else {
    if (local_20 != (char *)0x0 && 0 < idx) {
      do {
        pcVar2 = (char *)0x0;
        do {
          if (pcVar1[(long)pcVar2] == '\0') break;
          if (pcVar1[(long)pcVar2] == ',') {
            pcVar2 = pcVar1 + (long)pcVar2;
            goto LAB_002908d7;
          }
          pcVar2 = pcVar2 + 1;
        } while (local_20 != pcVar2);
        pcVar2 = (char *)0x0;
LAB_002908d7:
        if (pcVar2 == (char *)0x0) {
          iVar3 = 2;
          if (sticky == 0) {
            *itemlen = 0;
            iVar3 = 1;
          }
        }
        else {
          local_20 = pcVar1 + ((long)local_20 - (long)pcVar2);
          iVar3 = 0;
          pcVar1 = pcVar2;
        }
        if (iVar3 != 0) {
          if (iVar3 != 2) goto LAB_0029097b;
          break;
        }
        pcVar1 = pcVar1 + 1;
        local_20 = local_20 + -1;
        if ((idx < 2) || (idx = idx + -1, local_20 == (char *)0x0)) break;
      } while( true );
    }
    *itemlen = 0;
    if (local_20 != (char *)0x0) {
      pcVar2 = (char *)0x1;
      do {
        if (pcVar1[(long)(pcVar2 + -1)] == ',') {
          return pcVar1;
        }
        if (pcVar1[(long)(pcVar2 + -1)] == '=') {
          return pcVar1;
        }
        *itemlen = (size_t)pcVar2;
        bVar4 = pcVar2 != local_20;
        pcVar2 = pcVar2 + 1;
      } while (bVar4);
    }
  }
  return pcVar1;
}

Assistant:

const char *index_list(VMG_ size_t &itemlen, int item, int idx, int sticky)
    {
        /* get the item */
        size_t len;
        const char *str = get(vmg_ len, item);

        /* if we didn't find it, return failure */
        if (str == 0)
        {
            itemlen = 0;
            return 0;
        }

        /* skip items (delimited by commas) until we reach the target index */
        for ( ; idx > 0 && len != 0 ; --idx, ++str, --len)
        {
            /* find the next comma */
            const char *comma = lib_strnchr(str, len, ',');
            if (comma == 0)
            {
                /* 
                 *   No more commas, so the index is past the end of the
                 *   list.  If 'sticky' is true, use the last item; otherwise
                 *   return "not found".
                 */
                if (sticky)
                    break;
                else
                {
                    itemlen = 0;
                    return 0;
                }
            }
            
            /* advance to the comma */
            len -= comma - str;
            str = comma;
        }
        
        /* we have the item; measure its length, up to the next '=' or ',' */
        const char *p;
        for (p = str, itemlen = 0 ; len != 0 && *p != '=' && *p != ',' ;
             --len, ++p, ++itemlen) ;
        
        /* return the item pointer */
        return str;
    }